

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O1

bool __thiscall
GGSock::Serialize::operator()
          (Serialize *this,vector<char,_std::allocator<char>_> *t,SerializationBuffer *buffer,
          size_t *offset)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  char *p;
  pointer obj;
  int32_t n;
  int32_t local_34;
  
  bVar2 = operator()(this,&local_34,buffer,offset);
  pcVar1 = (t->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  for (obj = (t->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
             _M_start; obj != pcVar1; obj = obj + 1) {
    bVar3 = operator()(this,obj,buffer,offset);
    bVar2 = (bool)(bVar2 & bVar3);
  }
  return bVar2;
}

Assistant:

bool Serialize::operator()(const std::vector<T> & t, SerializationBuffer & buffer, size_t & offset) {
    bool res = true;

    int32_t n = (int32_t) t.size();
    res &= operator()(n, buffer, offset);
    for (const auto & p : t) {
        res &= operator()(p, buffer, offset);
    }

    return res;
}